

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O1

void __thiscall
kj::MainBuilder::MainImpl::operator()
          (MainImpl *this,StringPtr programName,ArrayPtr<const_kj::StringPtr> params)

{
  char cVar1;
  _Base_ptr p_Var2;
  StringPtr programName_00;
  StringPtr programName_01;
  StringPtr programName_02;
  StringPtr programName_03;
  StringPtr programName_04;
  StringPtr programName_05;
  StringPtr programName_06;
  StringPtr programName_07;
  StringPtr programName_08;
  StringPtr programName_09;
  StringPtr programName_10;
  StringPtr programName_11;
  StringPtr programName_12;
  StringPtr programName_13;
  StringPtr programName_14;
  StringPtr programName_15;
  StringPtr programName_16;
  StringPtr programName_17;
  StringPtr programName_18;
  StringPtr programName_19;
  StringPtr programName_20;
  void *__s;
  bool bVar3;
  StringPtr *pSVar4;
  RemoveConst<kj::StringPtr> *pRVar5;
  StringPtr *pSVar6;
  int iVar7;
  Arg *argSpec;
  iterator iVar8;
  void *pvVar9;
  iterator iVar10;
  undefined8 *puVar11;
  ulong uVar12;
  _Base_ptr p_Var13;
  ArrayPtr<const_char> *pAVar14;
  ArrayPtr<const_char> *pAVar15;
  ArrayPtr<const_char> *pAVar16;
  undefined8 uVar17;
  ArrayPtr<const_char> *pAVar18;
  size_t __n;
  long lVar19;
  ArrayPtr<const_char> *pAVar20;
  size_t sVar21;
  char *pcVar22;
  ulong uVar23;
  long *plVar24;
  ArrayPtr<const_char> *pAVar25;
  uint uVar26;
  ArrayPtr<const_char> *pAVar27;
  ArrayPtr<const_char> *unaff_R13;
  size_t sizeCopy;
  ArrayPtr<const_char> *pAVar28;
  ulong uVar29;
  kj *this_00;
  StringPtr message;
  StringPtr message_00;
  StringPtr message_01;
  StringPtr message_02;
  StringPtr message_03;
  StringPtr message_04;
  StringPtr message_05;
  StringPtr message_06;
  StringPtr message_07;
  StringPtr message_08;
  StringPtr message_09;
  StringPtr message_10;
  StringPtr message_11;
  StringPtr message_12;
  StringPtr message_13;
  StringPtr message_14;
  StringPtr message_15;
  StringPtr message_16;
  StringPtr message_17;
  NullableValue<kj::String> error;
  MainFunc subMain;
  StringPtr param;
  StringPtr arg;
  Vector<kj::StringPtr> arguments;
  StringPtr dummyArg;
  String *in_stack_fffffffffffffe38;
  undefined1 local_1b8 [16];
  ArrayPtr<const_char> *pAStack_1a8;
  ArrayPtr<const_char> *local_1a0;
  String local_198;
  ArrayPtr<const_char> *local_180;
  char *local_178;
  size_t local_170;
  undefined1 local_161 [17];
  long *local_150;
  key_type local_148;
  ulong local_130;
  ArrayPtr<const_char> *local_128;
  ArrayPtr<const_char> *local_120;
  key_type local_118;
  ArrayPtr<const_char> *local_108;
  ArrayPtr<const_char> *local_100;
  Vector<kj::StringPtr> local_f8;
  ArrayPtr<const_char> *local_d8;
  ArrayPtr<const_char> *local_d0;
  ArrayPtr<const_char> *local_c8;
  ArrayPtr<const_char> *local_c0;
  ArrayPtr<const_char> *local_b8;
  ArrayPtr<const_char> *local_b0;
  ArrayPtr<const_char> *local_a8;
  ArrayPtr<const_char> *local_a0;
  ArrayPtr<const_char> *local_98;
  ArrayPtr<const_char> *local_90;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> *local_78;
  ArrayPtr<const_char> *local_70;
  ArrayPtr<const_char> *local_68;
  ArrayPtr<const_char> *local_60;
  long local_58;
  long local_50;
  ArrayPtr<const_char> *local_48;
  ArrayPtr<const_char> *local_40;
  ArrayPtr<const_char> *local_38;
  
  pAVar28 = (ArrayPtr<const_char> *)params.size_;
  local_170 = programName.content.size_;
  local_178 = programName.content.ptr;
  local_f8.builder.ptr = (StringPtr *)0x0;
  local_f8.builder.pos = (RemoveConst<kj::StringPtr> *)0x0;
  local_f8.builder.endPtr = (StringPtr *)0x0;
  pAVar25 = (ArrayPtr<const_char> *)this;
  if (pAVar28 != (ArrayPtr<const_char> *)0x0) {
    local_a8 = (ArrayPtr<const_char> *)(local_170 - 1);
    local_a0 = &(params.ptr)->content + (long)pAVar28;
    unaff_R13 = (ArrayPtr<const_char> *)0x0;
    local_161._1_8_ = &(params.ptr)->content;
    local_128 = pAVar28;
    do {
      this = (MainImpl *)pAVar25;
      pAVar14 = local_128;
      pAVar25 = (ArrayPtr<const_char> *)(local_161._1_8_ + unaff_R13 * 0x10);
      local_148.content.ptr._0_4_ = *(undefined4 *)&((ArrayPtr<const_char> *)&pAVar25->ptr)->ptr;
      local_148.content.ptr._4_4_ =
           *(undefined4 *)((long)&((ArrayPtr<const_char> *)&pAVar25->ptr)->ptr + 4);
      local_148.content.size_._0_4_ = (undefined4)pAVar25->size_;
      local_148.content.size_._4_4_ = *(undefined4 *)((long)&pAVar25->size_ + 4);
      uVar12 = pAVar25->size_;
      if ((uVar12 == 3) &&
         (iVar7 = bcmp(((ArrayPtr<const_char> *)&pAVar25->ptr)->ptr,"--",2), iVar7 == 0)) {
        pAVar25 = (ArrayPtr<const_char> *)
                  (local_161._1_8_ +
                  (char *)((long)&((ArrayPtr<const_char> *)&unaff_R13->ptr)->ptr + 1) * 0x10);
        __n = (long)local_a0 - (long)pAVar25;
        uVar12 = ((long)__n >> 4) + ((long)local_f8.builder.pos - (long)local_f8.builder.ptr >> 4);
        if ((ulong)((long)local_f8.builder.endPtr - (long)local_f8.builder.ptr >> 4) < uVar12) {
          uVar29 = (long)local_f8.builder.endPtr - (long)local_f8.builder.ptr >> 3;
          if (local_f8.builder.endPtr == local_f8.builder.ptr) {
            uVar29 = 4;
          }
          if (uVar29 < uVar12) {
            uVar29 = uVar12;
          }
          Vector<kj::StringPtr>::setCapacity(&local_f8,uVar29);
        }
        pRVar5 = local_f8.builder.pos;
        if (local_a0 != pAVar25) {
          memcpy(local_f8.builder.pos,pAVar25,__n);
        }
        local_f8.builder.pos = (RemoveConst<kj::StringPtr> *)((long)pRVar5 + __n);
        local_130 = CONCAT44(local_130._4_4_,2);
LAB_002b3526:
        bVar3 = false;
        pAVar25 = (ArrayPtr<const_char> *)this;
      }
      else if ((uVar12 < 3) ||
              (*(short *)CONCAT44(local_148.content.ptr._4_4_,local_148.content.ptr._0_4_) != 0x2d2d
              )) {
        pAVar25 = (ArrayPtr<const_char> *)this;
        if (((uVar12 < 2) || (0xfffffffffffffffd < uVar12 - 3)) ||
           (*(char *)CONCAT44(local_148.content.ptr._4_4_,local_148.content.ptr._0_4_) != '-')) {
          if (*(long *)(((ArrayPtr<const_char> *)this)->size_ + 0xe0) == 0) {
            if (local_f8.builder.pos == local_f8.builder.endPtr) {
              sVar21 = (long)local_f8.builder.endPtr - (long)local_f8.builder.ptr >> 3;
              if (local_f8.builder.endPtr == local_f8.builder.ptr) {
                sVar21 = 4;
              }
              Vector<kj::StringPtr>::setCapacity(&local_f8,sVar21);
            }
            *(undefined4 *)local_f8.builder.pos = local_148.content.ptr._0_4_;
            *(undefined4 *)((long)local_f8.builder.pos + 4) = local_148.content.ptr._4_4_;
            *(undefined4 *)((long)local_f8.builder.pos + 8) = (undefined4)local_148.content.size_;
            *(undefined4 *)((long)local_f8.builder.pos + 0xc) = local_148.content.size_._4_4_;
            local_f8.builder.pos = (RemoveConst<kj::StringPtr> *)((long)local_f8.builder.pos + 0x10)
            ;
            local_130 = local_130 & 0xffffffff00000000;
            bVar3 = true;
            pAVar25 = (ArrayPtr<const_char> *)this;
          }
          else {
            iVar8 = std::
                    _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
                    ::find((_Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
                            *)(((ArrayPtr<const_char> *)this)->size_ + 0xb8),&local_148);
            sVar21 = ((ArrayPtr<const_char> *)this)->size_;
            p_Var13 = (_Base_ptr)(sVar21 + 0xc0);
            if (iVar8._M_node == p_Var13) {
              if ((CONCAT44(local_148.content.size_._4_4_,(undefined4)local_148.content.size_) != 5)
                 || (iVar7 = bcmp((void *)CONCAT44(local_148.content.ptr._4_4_,
                                                   local_148.content.ptr._0_4_),"help",4),
                    iVar7 != 0)) {
                str<kj::StringPtr&,char_const(&)[18]>
                          (&local_198,(kj *)&local_148,(StringPtr *)": unknown command",
                           (char (*) [18])p_Var13);
                pcVar22 = local_198.content.ptr;
                if ((ArrayPtr<const_char> *)local_198.content.size_ == (ArrayPtr<const_char> *)0x0)
                {
                  pcVar22 = "";
                }
                message_08.content.size_ =
                     (char *)((long)&((ArrayPtr<const_char> *)local_198.content.size_)->ptr +
                             (ulong)((ArrayPtr<const_char> *)local_198.content.size_ ==
                                    (ArrayPtr<const_char> *)0x0));
                programName_11.content.size_ = local_170;
                programName_11.content.ptr = local_178;
                message_08.content.ptr = pcVar22;
                usageError((MainImpl *)pAVar25,programName_11,message_08);
              }
              pAVar20 = (ArrayPtr<const_char> *)
                        ((long)&((ArrayPtr<const_char> *)&unaff_R13->ptr)->ptr + 1);
              if (pAVar14 <= pAVar20) {
                programName_07.content.size_ = local_170;
                programName_07.content.ptr = local_178;
                printHelp((MainImpl *)pAVar25,programName_07);
              }
              pAVar20 = (ArrayPtr<const_char> *)(local_161._1_8_ + pAVar20 * 0x10);
              iVar8 = std::
                      _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
                      ::find((_Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
                              *)(sVar21 + 0xb8),(key_type *)pAVar20);
              puVar11 = (undefined8 *)pAVar25->size_;
              p_Var13 = (_Base_ptr)(puVar11 + 0x18);
              if (iVar8._M_node != p_Var13) {
                (*(code *)**(undefined8 **)iVar8._M_node[1]._M_right)(local_161 + 9);
                local_88.ptr = "--help";
                local_88.size_ = 7;
                local_1b8._0_8_ = local_178;
                local_1b8._8_8_ = local_a8;
                local_161[0] = 0x20;
                local_118.ptr = pAVar20->ptr;
                local_118.size_ = pAVar20->size_ - 1;
                _::
                concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
                          (&local_198,(_ *)local_1b8,(ArrayPtr<const_char> *)local_161,
                           (FixedArray<char,_1UL> *)&local_118,pAVar28);
                pcVar22 = "";
                if ((ArrayPtr<const_char> *)local_198.content.size_ != (ArrayPtr<const_char> *)0x0)
                {
                  pcVar22 = local_198.content.ptr;
                }
                pAVar28 = (ArrayPtr<const_char> *)0x1;
                (**(code **)*local_150)
                          (local_150,pcVar22,
                           (char *)((long)&((ArrayPtr<const_char> *)local_198.content.size_)->ptr +
                                   (ulong)((ArrayPtr<const_char> *)local_198.content.size_ ==
                                          (ArrayPtr<const_char> *)0x0)));
                pAVar14 = (ArrayPtr<const_char> *)local_198.content.size_;
                pcVar22 = local_198.content.ptr;
                this = (MainImpl *)pAVar25;
                if (local_198.content.ptr != (char *)0x0) {
                  local_198.content.ptr = (char *)0x0;
                  local_198.content.size_ = 0;
                  (**(code **)((ArrayPtr<const_char> *)&(local_198.content.disposer)->field_0x0)->
                              ptr)(local_198.content.disposer,pcVar22,1);
                  pAVar28 = pAVar14;
                  this = (MainImpl *)pAVar25;
                }
                plVar24 = local_150;
                if (local_150 != (long *)0x0) {
                  local_150 = (long *)0x0;
                  (*(code *)**(undefined8 **)CONCAT71(local_161._10_7_,local_161[9]))
                            ((undefined8 *)CONCAT71(local_161._10_7_,local_161[9]),
                             (long)plVar24 + *(long *)(*plVar24 + -0x10));
                }
                local_130 = CONCAT44(local_130._4_4_,1);
                goto LAB_002b3526;
              }
              if ((pAVar20->size_ != 5) || (iVar7 = bcmp(pAVar20->ptr,"help",4), iVar7 != 0)) {
                str<kj::StringPtr_const&,char_const(&)[18]>
                          (&local_198,(kj *)pAVar20,(StringPtr *)": unknown command",
                           (char (*) [18])p_Var13);
                pcVar22 = local_198.content.ptr;
                if ((ArrayPtr<const_char> *)local_198.content.size_ == (ArrayPtr<const_char> *)0x0)
                {
                  pcVar22 = "";
                }
                message_10.content.size_ =
                     (char *)((long)&((ArrayPtr<const_char> *)local_198.content.size_)->ptr +
                             (ulong)((ArrayPtr<const_char> *)local_198.content.size_ ==
                                    (ArrayPtr<const_char> *)0x0));
                programName_13.content.size_ = local_170;
                programName_13.content.ptr = local_178;
                message_10.content.ptr = pcVar22;
                usageError((MainImpl *)pAVar25,programName_13,message_10);
              }
              pAVar28 = (ArrayPtr<const_char> *)(ulong)((int)unaff_R13 + 2);
              uVar26 = 0;
              if (local_128 <= pAVar28) goto LAB_002b40bf;
              uVar26 = 0;
              goto LAB_002b405e;
            }
            (*(code *)**(undefined8 **)iVar8._M_node[1]._M_right)(local_161 + 9);
            local_1b8._0_8_ = local_178;
            local_1b8._8_8_ = local_a8;
            local_88.ptr = (char *)CONCAT71(local_88.ptr._1_7_,0x20);
            local_118.ptr =
                 (char *)CONCAT44(local_148.content.ptr._4_4_,local_148.content.ptr._0_4_);
            local_118.size_ =
                 CONCAT44(local_148.content.size_._4_4_,(undefined4)local_148.content.size_) - 1;
            _::concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
                      (&local_198,(_ *)local_1b8,&local_88,(FixedArray<char,_1UL> *)&local_118,
                       pAVar28);
            pcVar22 = "";
            if ((ArrayPtr<const_char> *)local_198.content.size_ != (ArrayPtr<const_char> *)0x0) {
              pcVar22 = local_198.content.ptr;
            }
            pAVar28 = (ArrayPtr<const_char> *)
                      ((long)pAVar14 -
                      (long)((long)&((ArrayPtr<const_char> *)&unaff_R13->ptr)->ptr + 1));
            (**(code **)*local_150)
                      (local_150,pcVar22,
                       (char *)((long)&((ArrayPtr<const_char> *)local_198.content.size_)->ptr +
                               (ulong)((ArrayPtr<const_char> *)local_198.content.size_ ==
                                      (ArrayPtr<const_char> *)0x0)));
            pAVar14 = (ArrayPtr<const_char> *)local_198.content.size_;
            pcVar22 = local_198.content.ptr;
            if (local_198.content.ptr != (char *)0x0) {
              local_198.content.ptr = (char *)0x0;
              local_198.content.size_ = 0;
              (**(code **)((ArrayPtr<const_char> *)&(local_198.content.disposer)->field_0x0)->ptr)
                        (local_198.content.disposer,pcVar22,1);
              pAVar28 = pAVar14;
            }
            plVar24 = local_150;
            if (local_150 != (long *)0x0) {
              local_150 = (long *)0x0;
              (*(code *)**(undefined8 **)CONCAT71(local_161._10_7_,local_161[9]))
                        ((undefined8 *)CONCAT71(local_161._10_7_,local_161[9]),
                         (long)plVar24 + *(long *)(*plVar24 + -0x10));
            }
            local_130 = CONCAT44(local_130._4_4_,1);
            bVar3 = false;
          }
        }
        else {
          lVar19 = CONCAT44(local_148.content.size_._4_4_,(undefined4)local_148.content.size_);
          uVar12 = lVar19 - 1;
          local_130 = local_130 & 0xffffffff00000000;
          bVar3 = true;
          if (1 < uVar12) {
            uVar29 = 1;
            do {
              local_161[9] = *(char *)(CONCAT44(local_148.content.ptr._4_4_,
                                                local_148.content.ptr._0_4_) + uVar29);
              pAVar20 = (ArrayPtr<const_char> *)(((ArrayPtr<const_char> *)this)->size_ + 0x60);
              pAVar28 = pAVar20;
              for (pAVar14 = *(ArrayPtr<const_char> **)
                              (((ArrayPtr<const_char> *)this)->size_ + 0x68);
                  pAVar14 != (ArrayPtr<const_char> *)0x0;
                  pAVar14 = (ArrayPtr<const_char> *)
                            (&((ArrayPtr<const_char> *)&pAVar14[1].ptr)->ptr)[cVar1 < local_161[9]])
              {
                cVar1 = *(char *)&((ArrayPtr<const_char> *)&pAVar14[2].ptr)->ptr;
                if (local_161[9] <= cVar1) {
                  pAVar28 = pAVar14;
                }
              }
              pAVar14 = pAVar20;
              if ((pAVar28 != pAVar20) &&
                 (pAVar14 = pAVar28,
                 local_161[9] < *(char *)&((ArrayPtr<const_char> *)&pAVar28[2].ptr)->ptr)) {
                pAVar28 = pAVar20;
                pAVar14 = pAVar20;
              }
              if (pAVar14 == pAVar20) {
                str<char_const(&)[2],char&,char_const(&)[22]>
                          (&local_198,(kj *)0x32412e,(char (*) [2])(local_161 + 9),
                           ": unrecognized option",(char (*) [22])pAVar28);
                pcVar22 = local_198.content.ptr;
                if ((ArrayPtr<const_char> *)local_198.content.size_ == (ArrayPtr<const_char> *)0x0)
                {
                  pcVar22 = "";
                }
                message_02.content.size_ =
                     (char *)((long)&((ArrayPtr<const_char> *)local_198.content.size_)->ptr +
                             (ulong)((ArrayPtr<const_char> *)local_198.content.size_ ==
                                    (ArrayPtr<const_char> *)0x0));
                programName_03.content.size_ = local_170;
                programName_03.content.ptr = local_178;
                message_02.content.ptr = pcVar22;
                usageError((MainImpl *)pAVar25,programName_03,message_02);
              }
              sVar21 = pAVar14[2].size_;
              cVar1 = *(char *)(sVar21 + 0x10);
              if (cVar1 == '\x01') {
                uVar23 = (ulong)((int)uVar29 + 1);
                if (uVar23 < uVar12) {
                  local_118.ptr =
                       (char *)(CONCAT44(local_148.content.ptr._4_4_,local_148.content.ptr._0_4_) +
                               uVar23);
                  local_118.size_ = lVar19 - uVar23;
                  (**(code **)**(undefined8 **)(*(long *)(sVar21 + 0x18) + 8))(local_1b8);
                  uVar17 = local_1b8._8_8_;
                  pAVar14 = local_b0;
                  if (local_1b8[0] == (_)0x1) {
                    local_108 = pAStack_1a8;
                    local_90 = local_1a0;
                    local_1b8._8_8_ = (ArrayPtr<const_char> *)0x0;
                    pAStack_1a8 = (ArrayPtr<const_char> *)0x0;
                    pAVar14 = (ArrayPtr<const_char> *)uVar17;
                  }
                  pAVar20 = pAStack_1a8;
                  uVar17 = local_1b8._8_8_;
                  local_198.content.ptr = (char *)CONCAT71(local_198.content.ptr._1_7_,local_1b8[0])
                  ;
                  local_b0 = pAVar14;
                  if (local_1b8[0] != (_)0x0) {
                    local_198.content.disposer = (ArrayDisposer *)local_108;
                    local_180 = local_90;
                    local_108 = (ArrayPtr<const_char> *)0x0;
                    local_b0 = (ArrayPtr<const_char> *)0x0;
                    local_198.content.size_ = (size_t)pAVar14;
                  }
                  if ((local_1b8[0] == (_)0x1) &&
                     ((ArrayPtr<const_char> *)local_1b8._8_8_ != (ArrayPtr<const_char> *)0x0)) {
                    local_1b8._8_8_ = (ArrayPtr<const_char> *)0x0;
                    pAStack_1a8 = (ArrayPtr<const_char> *)0x0;
                    (**(code **)((ArrayPtr<const_char> *)&local_1a0->ptr)->ptr)(local_1a0,uVar17,1);
                    pAVar28 = pAVar20;
                  }
                  if ((char)local_198.content.ptr == '\x01') {
                    str<char_const(&)[2],char&,char_const(&)[2],kj::StringPtr&,char_const(&)[3],kj::String&>
                              ((String *)local_1b8,(kj *)0x32412e,(char (*) [2])(local_161 + 9)," ",
                               (char (*) [2])&local_118,(StringPtr *)0x322a4d,
                               (char (*) [3])&local_198.content.size_,(String *)pAVar25);
                    pcVar22 = (char *)local_1b8._0_8_;
                    if ((ArrayPtr<const_char> *)local_1b8._8_8_ == (ArrayPtr<const_char> *)0x0) {
                      pcVar22 = "";
                    }
                    message_06.content.size_ =
                         (char *)((long)&((ArrayPtr<const_char> *)local_1b8._8_8_)->ptr +
                                 (ulong)((ArrayPtr<const_char> *)local_1b8._8_8_ ==
                                        (ArrayPtr<const_char> *)0x0));
                    programName_09.content.size_ = local_170;
                    programName_09.content.ptr = local_178;
                    message_06.content.ptr = pcVar22;
                    usageError((MainImpl *)pAVar25,programName_09,message_06);
                  }
                }
                else {
                  unaff_R13 = (ArrayPtr<const_char> *)
                              ((long)&((ArrayPtr<const_char> *)&unaff_R13->ptr)->ptr + 1);
                  if (local_128 <= unaff_R13) {
LAB_002b3e5c:
                    str<char_const(&)[2],char&,char_const(&)[19]>
                              (&local_198,(kj *)0x32412e,(char (*) [2])(local_161 + 9),
                               ": missing argument",(char (*) [19])pAVar28);
                    pcVar22 = local_198.content.ptr;
                    if ((ArrayPtr<const_char> *)local_198.content.size_ ==
                        (ArrayPtr<const_char> *)0x0) {
                      pcVar22 = "";
                    }
                    message_04.content.size_ =
                         (char *)((long)&((ArrayPtr<const_char> *)local_198.content.size_)->ptr +
                                 (ulong)((ArrayPtr<const_char> *)local_198.content.size_ ==
                                        (ArrayPtr<const_char> *)0x0));
                    programName_06.content.size_ = local_170;
                    programName_06.content.ptr = local_178;
                    message_04.content.ptr = pcVar22;
                    usageError((MainImpl *)pAVar25,programName_06,message_04);
                  }
                  pAVar14 = (ArrayPtr<const_char> *)(local_161._1_8_ + unaff_R13 * 0x10);
                  if (((1 < ((ArrayPtr<const_char> *)(local_161._1_8_ + unaff_R13 * 0x10))->size_)
                      && (((ArrayPtr<const_char> *)(local_161._1_8_ + unaff_R13 * 0x10))->size_ != 2
                         )) && (*((ArrayPtr<const_char> *)&pAVar14->ptr)->ptr == '-'))
                  goto LAB_002b3e5c;
                  puVar11 = *(undefined8 **)(*(long *)(sVar21 + 0x18) + 8);
                  (**(code **)*puVar11)
                            (local_1b8,puVar11,((ArrayPtr<const_char> *)&pAVar14->ptr)->ptr);
                  uVar17 = local_1b8._8_8_;
                  pAVar20 = local_b8;
                  if (local_1b8[0] == (_)0x1) {
                    local_d0 = pAStack_1a8;
                    local_98 = local_1a0;
                    local_1b8._8_8_ = (ArrayPtr<const_char> *)0x0;
                    pAStack_1a8 = (ArrayPtr<const_char> *)0x0;
                    pAVar20 = (ArrayPtr<const_char> *)uVar17;
                  }
                  pAVar15 = pAStack_1a8;
                  uVar17 = local_1b8._8_8_;
                  local_198.content.ptr = (char *)CONCAT71(local_198.content.ptr._1_7_,local_1b8[0])
                  ;
                  local_b8 = pAVar20;
                  if (local_1b8[0] != (_)0x0) {
                    local_198.content.disposer = (ArrayDisposer *)local_d0;
                    local_180 = local_98;
                    local_d0 = (ArrayPtr<const_char> *)0x0;
                    local_b8 = (ArrayPtr<const_char> *)0x0;
                    local_198.content.size_ = (size_t)pAVar20;
                  }
                  this = (MainImpl *)pAVar25;
                  if ((local_1b8[0] == (_)0x1) &&
                     ((ArrayPtr<const_char> *)local_1b8._8_8_ != (ArrayPtr<const_char> *)0x0)) {
                    local_1b8._8_8_ = (ArrayPtr<const_char> *)0x0;
                    pAStack_1a8 = (ArrayPtr<const_char> *)0x0;
                    (**(code **)((ArrayPtr<const_char> *)&local_1a0->ptr)->ptr)(local_1a0,uVar17,1);
                    pAVar28 = pAVar15;
                    this = (MainImpl *)pAVar25;
                  }
                  pAVar25 = (ArrayPtr<const_char> *)this;
                  if ((char)local_198.content.ptr == '\x01') {
                    str<char_const(&)[2],char&,char_const(&)[2],kj::StringPtr_const&,char_const(&)[3],kj::String&>
                              ((String *)local_1b8,(kj *)0x32412e,(char (*) [2])(local_161 + 9)," ",
                               (char (*) [2])pAVar14,(StringPtr *)0x322a4d,
                               (char (*) [3])&local_198.content.size_,(String *)this);
                    pcVar22 = (char *)local_1b8._0_8_;
                    if ((ArrayPtr<const_char> *)local_1b8._8_8_ == (ArrayPtr<const_char> *)0x0) {
                      pcVar22 = "";
                    }
                    message_05.content.size_ =
                         (char *)((long)&((ArrayPtr<const_char> *)local_1b8._8_8_)->ptr +
                                 (ulong)((ArrayPtr<const_char> *)local_1b8._8_8_ ==
                                        (ArrayPtr<const_char> *)0x0));
                    programName_08.content.size_ = local_170;
                    programName_08.content.ptr = local_178;
                    message_05.content.ptr = pcVar22;
                    usageError(this,programName_08,message_05);
                  }
                }
              }
              else {
                (**(code **)**(undefined8 **)(*(long *)(sVar21 + 0x18) + 8))(local_1b8);
                uVar17 = local_1b8._8_8_;
                pAVar20 = local_100;
                if (local_1b8[0] == (_)0x1) {
                  local_120 = pAStack_1a8;
                  local_d8 = local_1a0;
                  local_1b8._8_8_ = (ArrayPtr<const_char> *)0x0;
                  pAStack_1a8 = (ArrayPtr<const_char> *)0x0;
                  pAVar20 = (ArrayPtr<const_char> *)uVar17;
                }
                pAVar15 = pAStack_1a8;
                uVar17 = local_1b8._8_8_;
                local_198.content.ptr = (char *)CONCAT71(local_198.content.ptr._1_7_,local_1b8[0]);
                local_100 = pAVar20;
                if (local_1b8[0] != (_)0x0) {
                  local_198.content.disposer = (ArrayDisposer *)local_120;
                  local_180 = local_d8;
                  local_120 = (ArrayPtr<const_char> *)0x0;
                  local_100 = (ArrayPtr<const_char> *)0x0;
                  local_198.content.size_ = (size_t)pAVar20;
                }
                if ((local_1b8[0] == (_)0x1) &&
                   ((ArrayPtr<const_char> *)local_1b8._8_8_ != (ArrayPtr<const_char> *)0x0)) {
                  local_1b8._8_8_ = (ArrayPtr<const_char> *)0x0;
                  pAStack_1a8 = (ArrayPtr<const_char> *)0x0;
                  pAVar14 = (ArrayPtr<const_char> *)0x0;
                  (**(code **)((ArrayPtr<const_char> *)&local_1a0->ptr)->ptr)(local_1a0,uVar17,1);
                  pAVar28 = pAVar15;
                }
                if ((char)local_198.content.ptr == '\x01') {
                  str<char_const(&)[2],char&,char_const(&)[3],kj::String&>
                            ((String *)local_1b8,(kj *)0x32412e,(char (*) [2])(local_161 + 9),": ",
                             (char (*) [3])&local_198.content.size_,(String *)pAVar14);
                  pcVar22 = (char *)local_1b8._0_8_;
                  if ((ArrayPtr<const_char> *)local_1b8._8_8_ == (ArrayPtr<const_char> *)0x0) {
                    pcVar22 = "";
                  }
                  message_03.content.size_ =
                       (char *)((long)&((ArrayPtr<const_char> *)local_1b8._8_8_)->ptr +
                               (ulong)((ArrayPtr<const_char> *)local_1b8._8_8_ ==
                                      (ArrayPtr<const_char> *)0x0));
                  programName_04.content.size_ = local_170;
                  programName_04.content.ptr = local_178;
                  message_03.content.ptr = pcVar22;
                  usageError((MainImpl *)pAVar25,programName_04,message_03);
                }
              }
              if (cVar1 != '\0') break;
              uVar29 = (ulong)((int)uVar29 + 1);
              lVar19 = CONCAT44(local_148.content.size_._4_4_,(undefined4)local_148.content.size_);
              uVar12 = lVar19 - 1;
            } while (uVar29 < uVar12);
          }
        }
      }
      else {
        local_118.ptr = (char *)0x0;
        local_118.size_ = 0;
        __s = (void *)CONCAT44(local_148.content.ptr._4_4_,local_148.content.ptr._0_4_);
        pvVar9 = memchr(__s,0x3d,uVar12 - 1);
        local_118.ptr = (char *)((long)__s + 2);
        if (pvVar9 == (void *)0x0) {
          local_118.size_ = uVar12 - 3;
        }
        else {
          local_118.size_ = (long)pvVar9 + (-2 - (long)__s);
          local_50 = (long)pvVar9 + 1;
          local_58 = uVar12 - ((long)pvVar9 + (1 - (long)__s));
        }
        pAVar14 = (ArrayPtr<const_char> *)this;
        iVar10 = std::
                 _Rb_tree<kj::ArrayPtr<const_char>,_std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>,_std::_Select1st<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>,_kj::MainBuilder::Impl::CharArrayCompare,_std::allocator<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>_>
                 ::find((_Rb_tree<kj::ArrayPtr<const_char>,_std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>,_std::_Select1st<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>,_kj::MainBuilder::Impl::CharArrayCompare,_std::allocator<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>_>
                         *)(((ArrayPtr<const_char> *)this)->size_ + 0x88),&local_118);
        pAVar25 = local_38;
        if (iVar10._M_node == (_Base_ptr)(((ArrayPtr<const_char> *)this)->size_ + 0x90)) {
          if ((CONCAT44(local_148.content.size_._4_4_,(undefined4)local_148.content.size_) == 7) &&
             (iVar7 = bcmp((void *)CONCAT44(local_148.content.ptr._4_4_,local_148.content.ptr._0_4_)
                           ,"--help",6), iVar7 == 0)) {
            programName_05.content.size_ = local_170;
            programName_05.content.ptr = local_178;
            printHelp((MainImpl *)pAVar14,programName_05);
          }
          str<char_const(&)[3],kj::ArrayPtr<char_const>&,char_const(&)[22]>
                    (&local_198,(kj *)"--",(char (*) [3])&local_118,
                     (ArrayPtr<const_char> *)": unrecognized option",(char (*) [22])pAVar28);
          pcVar22 = local_198.content.ptr;
          if ((ArrayPtr<const_char> *)local_198.content.size_ == (ArrayPtr<const_char> *)0x0) {
            pcVar22 = "";
          }
          message_09.content.size_ =
               (char *)((long)&((ArrayPtr<const_char> *)local_198.content.size_)->ptr +
                       (ulong)((ArrayPtr<const_char> *)local_198.content.size_ ==
                              (ArrayPtr<const_char> *)0x0));
          programName_12.content.size_ = local_170;
          programName_12.content.ptr = local_178;
          message_09.content.ptr = pcVar22;
          usageError((MainImpl *)pAVar14,programName_12,message_09);
        }
        p_Var2 = iVar10._M_node[1]._M_left;
        this = (MainImpl *)pAVar14;
        if (*(char *)&p_Var2->_M_left == '\x01') {
          if (pvVar9 == (void *)0x0) {
            unaff_R13 = (ArrayPtr<const_char> *)
                        ((long)&((ArrayPtr<const_char> *)&unaff_R13->ptr)->ptr + 1);
            if (local_128 <= unaff_R13) {
LAB_002b42b1:
              str<char_const(&)[3],kj::ArrayPtr<char_const>&,char_const(&)[19]>
                        (&local_198,(kj *)"--",(char (*) [3])&local_118,
                         (ArrayPtr<const_char> *)": missing argument",(char (*) [19])pAVar28);
              pcVar22 = local_198.content.ptr;
              if ((ArrayPtr<const_char> *)local_198.content.size_ == (ArrayPtr<const_char> *)0x0) {
                pcVar22 = "";
              }
              message_16.content.size_ =
                   (char *)((long)&((ArrayPtr<const_char> *)local_198.content.size_)->ptr +
                           (ulong)((ArrayPtr<const_char> *)local_198.content.size_ ==
                                  (ArrayPtr<const_char> *)0x0));
              programName_19.content.size_ = local_170;
              programName_19.content.ptr = local_178;
              message_16.content.ptr = pcVar22;
              usageError((MainImpl *)pAVar14,programName_19,message_16);
            }
            pAVar15 = (ArrayPtr<const_char> *)(local_161._1_8_ + unaff_R13 * 0x10);
            if (((1 < ((ArrayPtr<const_char> *)(local_161._1_8_ + unaff_R13 * 0x10))->size_) &&
                (((ArrayPtr<const_char> *)(local_161._1_8_ + unaff_R13 * 0x10))->size_ != 2)) &&
               (*((ArrayPtr<const_char> *)&pAVar15->ptr)->ptr == '-')) goto LAB_002b42b1;
            p_Var2 = p_Var2->_M_right->_M_parent;
            (*(code *)**(undefined8 **)p_Var2)
                      (local_1b8,p_Var2,((ArrayPtr<const_char> *)&pAVar15->ptr)->ptr);
            pAVar25 = pAStack_1a8;
            uVar17 = local_1b8._8_8_;
            pAVar18 = local_70;
            pAVar27 = local_78;
            if (local_1b8[0] == (_)0x1) {
              local_1b8._8_8_ = (ArrayPtr<const_char> *)0x0;
              pAStack_1a8 = (ArrayPtr<const_char> *)0x0;
              pAVar18 = pAVar25;
              local_68 = local_1a0;
              pAVar27 = (ArrayPtr<const_char> *)uVar17;
            }
            pAVar25 = pAStack_1a8;
            uVar17 = local_1b8._8_8_;
            local_198.content.ptr = (char *)CONCAT71(local_198.content.ptr._1_7_,local_1b8[0]);
            pAVar20 = pAVar18;
            pAVar16 = pAVar27;
            if (local_1b8[0] != (_)0x0) {
              pAVar20 = (ArrayPtr<const_char> *)0x0;
              pAVar16 = (ArrayPtr<const_char> *)0x0;
              local_198.content.size_ = (size_t)pAVar27;
              local_198.content.disposer = (ArrayDisposer *)pAVar18;
              local_180 = local_68;
            }
            this = (MainImpl *)pAVar14;
            if ((local_1b8[0] == (_)0x1) &&
               ((ArrayPtr<const_char> *)local_1b8._8_8_ != (ArrayPtr<const_char> *)0x0)) {
              local_1b8._8_8_ = (ArrayPtr<const_char> *)0x0;
              pAStack_1a8 = (ArrayPtr<const_char> *)0x0;
              (**(code **)((ArrayPtr<const_char> *)&local_1a0->ptr)->ptr)(local_1a0,uVar17,1);
              pAVar28 = pAVar25;
              this = (MainImpl *)pAVar14;
            }
            pAVar25 = (ArrayPtr<const_char> *)this;
            if ((char)local_198.content.ptr == '\x01') {
              str<kj::StringPtr&,char_const(&)[2],kj::StringPtr_const&,char_const(&)[3],kj::String&>
                        ((String *)local_1b8,(kj *)&local_148,(StringPtr *)"=",(char (*) [2])pAVar15
                         ,(StringPtr *)0x322a4d,(char (*) [3])&local_198.content.size_,
                         in_stack_fffffffffffffe38);
              pcVar22 = (char *)local_1b8._0_8_;
              if ((ArrayPtr<const_char> *)local_1b8._8_8_ == (ArrayPtr<const_char> *)0x0) {
                pcVar22 = "";
              }
              message_17.content.size_ =
                   (char *)((long)&((ArrayPtr<const_char> *)local_1b8._8_8_)->ptr +
                           (ulong)((ArrayPtr<const_char> *)local_1b8._8_8_ ==
                                  (ArrayPtr<const_char> *)0x0));
              programName_20.content.size_ = local_170;
              programName_20.content.ptr = local_178;
              message_17.content.ptr = pcVar22;
              usageError(this,programName_20,message_17);
            }
          }
          else {
            p_Var2 = p_Var2->_M_right->_M_parent;
            (*(code *)**(undefined8 **)p_Var2)(local_1b8,p_Var2,local_50);
            pAVar14 = pAStack_1a8;
            uVar17 = local_1b8._8_8_;
            pAVar20 = local_c8;
            if (local_1b8[0] == (_)0x1) {
              local_1b8._8_8_ = (ArrayPtr<const_char> *)0x0;
              pAStack_1a8 = (ArrayPtr<const_char> *)0x0;
              pAVar20 = pAVar14;
              local_60 = local_1a0;
              pAVar25 = (ArrayPtr<const_char> *)uVar17;
            }
            pAVar15 = pAStack_1a8;
            uVar17 = local_1b8._8_8_;
            local_198.content.ptr = (char *)CONCAT71(local_198.content.ptr._1_7_,local_1b8[0]);
            pAVar14 = pAVar25;
            local_c8 = pAVar20;
            if (local_1b8[0] != (_)0x0) {
              local_c8 = (ArrayPtr<const_char> *)0x0;
              pAVar14 = (ArrayPtr<const_char> *)0x0;
              local_180 = local_60;
              local_198.content.disposer = (ArrayDisposer *)pAVar20;
              local_198.content.size_ = (size_t)pAVar25;
            }
            pAVar25 = (ArrayPtr<const_char> *)this;
            if ((local_1b8[0] == (_)0x1) &&
               ((ArrayPtr<const_char> *)local_1b8._8_8_ != (ArrayPtr<const_char> *)0x0)) {
              local_1b8._8_8_ = (ArrayPtr<const_char> *)0x0;
              pAStack_1a8 = (ArrayPtr<const_char> *)0x0;
              (**(code **)((ArrayPtr<const_char> *)&local_1a0->ptr)->ptr)(local_1a0,uVar17,1);
              pAVar28 = pAVar15;
            }
            pAVar16 = local_78;
            pAVar20 = local_70;
            local_38 = pAVar14;
            if ((char)local_198.content.ptr == '\x01') {
              str<kj::StringPtr&,char_const(&)[3],kj::String&>
                        ((String *)local_1b8,(kj *)&local_148,(StringPtr *)0x322a4d,
                         (char (*) [3])&local_198.content.size_,(String *)pAVar28);
              pcVar22 = (char *)local_1b8._0_8_;
              if ((ArrayPtr<const_char> *)local_1b8._8_8_ == (ArrayPtr<const_char> *)0x0) {
                pcVar22 = "";
              }
              message_15.content.size_ =
                   (char *)((long)&((ArrayPtr<const_char> *)local_1b8._8_8_)->ptr +
                           (ulong)((ArrayPtr<const_char> *)local_1b8._8_8_ ==
                                  (ArrayPtr<const_char> *)0x0));
              programName_18.content.size_ = local_170;
              programName_18.content.ptr = local_178;
              message_15.content.ptr = pcVar22;
              usageError((MainImpl *)pAVar25,programName_18,message_15);
            }
          }
        }
        else {
          if (pvVar9 != (void *)0x0) {
            str<char_const(&)[3],kj::ArrayPtr<char_const>&,char_const(&)[37]>
                      (&local_198,(kj *)"--",(char (*) [3])&local_118,
                       (ArrayPtr<const_char> *)": option does not accept an argument",
                       (char (*) [37])pAVar28);
            pcVar22 = local_198.content.ptr;
            if ((ArrayPtr<const_char> *)local_198.content.size_ == (ArrayPtr<const_char> *)0x0) {
              pcVar22 = "";
            }
            message_11.content.size_ =
                 (char *)((long)&((ArrayPtr<const_char> *)local_198.content.size_)->ptr +
                         (ulong)((ArrayPtr<const_char> *)local_198.content.size_ ==
                                (ArrayPtr<const_char> *)0x0));
            programName_14.content.size_ = local_170;
            programName_14.content.ptr = local_178;
            message_11.content.ptr = pcVar22;
            usageError((MainImpl *)pAVar14,programName_14,message_11);
          }
          (*(code *)**(undefined8 **)p_Var2->_M_right->_M_parent)(local_1b8);
          pAVar25 = pAStack_1a8;
          uVar17 = local_1b8._8_8_;
          pAVar14 = local_40;
          pAVar20 = local_c0;
          if (local_1b8[0] == (_)0x1) {
            local_1b8._8_8_ = (ArrayPtr<const_char> *)0x0;
            pAStack_1a8 = (ArrayPtr<const_char> *)0x0;
            pAVar14 = pAVar25;
            pAVar20 = (ArrayPtr<const_char> *)uVar17;
            local_48 = local_1a0;
          }
          pAVar16 = pAStack_1a8;
          uVar17 = local_1b8._8_8_;
          local_198.content.ptr = (char *)CONCAT71(local_198.content.ptr._1_7_,local_1b8[0]);
          local_c0 = pAVar20;
          pAVar15 = pAVar14;
          if (local_1b8[0] != (_)0x0) {
            pAVar15 = (ArrayPtr<const_char> *)0x0;
            local_c0 = (ArrayPtr<const_char> *)0x0;
            local_180 = local_48;
            local_198.content.disposer = (ArrayDisposer *)pAVar14;
            local_198.content.size_ = (size_t)pAVar20;
          }
          pAVar25 = (ArrayPtr<const_char> *)this;
          if ((local_1b8[0] == (_)0x1) &&
             ((ArrayPtr<const_char> *)local_1b8._8_8_ != (ArrayPtr<const_char> *)0x0)) {
            local_1b8._8_8_ = (ArrayPtr<const_char> *)0x0;
            pAStack_1a8 = (ArrayPtr<const_char> *)0x0;
            (**(code **)((ArrayPtr<const_char> *)&local_1a0->ptr)->ptr)(local_1a0,uVar17,1);
            pAVar28 = pAVar16;
          }
          pAVar16 = local_78;
          pAVar20 = local_70;
          local_40 = pAVar15;
          if ((char)local_198.content.ptr == '\x01') {
            str<kj::StringPtr&,char_const(&)[3],kj::String&>
                      ((String *)local_1b8,(kj *)&local_148,(StringPtr *)0x322a4d,
                       (char (*) [3])&local_198.content.size_,(String *)pAVar28);
            pcVar22 = (char *)local_1b8._0_8_;
            if ((ArrayPtr<const_char> *)local_1b8._8_8_ == (ArrayPtr<const_char> *)0x0) {
              pcVar22 = "";
            }
            message_12.content.size_ =
                 (char *)((long)&((ArrayPtr<const_char> *)local_1b8._8_8_)->ptr +
                         (ulong)((ArrayPtr<const_char> *)local_1b8._8_8_ ==
                                (ArrayPtr<const_char> *)0x0));
            programName_15.content.size_ = local_170;
            programName_15.content.ptr = local_178;
            message_12.content.ptr = pcVar22;
            usageError((MainImpl *)pAVar25,programName_15,message_12);
          }
        }
        local_70 = pAVar20;
        local_78 = pAVar16;
        local_130 = local_130 & 0xffffffff00000000;
        bVar3 = true;
      }
      if (!bVar3) goto LAB_002b38fa;
      unaff_R13 = (ArrayPtr<const_char> *)
                  ((long)&((ArrayPtr<const_char> *)&unaff_R13->ptr)->ptr + 1);
    } while (unaff_R13 < local_128);
    local_130 = CONCAT44(local_130._4_4_,2);
LAB_002b38fa:
    if ((int)local_130 != 2) goto LAB_002b3ca2;
  }
  sVar21 = ((ArrayPtr<const_char> *)this)->size_;
  if (*(long *)(sVar21 + 0xe0) != 0) {
    programName_10.content.size_ = local_170;
    programName_10.content.ptr = local_178;
    message_07.content.size_ = 0x10;
    message_07.content.ptr = "missing command";
    usageError(this,programName_10,message_07);
  }
  pAVar15 = *(ArrayPtr<const_char> **)(sVar21 + 0xf0);
  pAVar14 = (ArrayPtr<const_char> *)0x0;
  pAVar20 = *(ArrayPtr<const_char> **)(sVar21 + 0xe8);
  for (pAVar16 = pAVar20; pAVar16 != pAVar15; pAVar16 = (ArrayPtr<const_char> *)&pAVar16[2].size_) {
    pAVar14 = (ArrayPtr<const_char> *)
              (ulong)(uint)((int)pAVar14 + *(int *)&((ArrayPtr<const_char> *)&pAVar16[2].ptr)->ptr);
  }
  this_00 = (kj *)local_f8.builder.ptr;
  if (pAVar20 != pAVar15) {
    local_d8 = (ArrayPtr<const_char> *)CONCAT44(local_d8._4_4_,(int)pAVar14);
    local_108 = pAVar15;
    do {
      if (*(int *)&pAVar20[2].ptr == 0) {
        uVar26 = 0;
      }
      else {
        uVar26 = 0;
        do {
          if (this_00 == (kj *)local_f8.builder.pos) {
            str<char_const(&)[18],kj::StringPtr&>
                      (&local_198,(kj *)"missing argument ",(char (*) [18])pAVar20,
                       (StringPtr *)pAVar14);
            pcVar22 = local_198.content.ptr;
            if ((ArrayPtr<const_char> *)local_198.content.size_ == (ArrayPtr<const_char> *)0x0) {
              pcVar22 = "";
            }
            message_00.content.size_ =
                 (char *)((long)&((ArrayPtr<const_char> *)local_198.content.size_)->ptr +
                         (ulong)((ArrayPtr<const_char> *)local_198.content.size_ ==
                                (ArrayPtr<const_char> *)0x0));
            programName_01.content.size_ = local_170;
            programName_01.content.ptr = local_178;
            message_00.content.ptr = pcVar22;
            usageError((MainImpl *)pAVar25,programName_01,message_00);
          }
          pAVar14 = *(ArrayPtr<const_char> **)(this_00 + 8);
          (*(code *)**(undefined8 **)pAVar20[1].size_)
                    (local_1b8,(undefined8 *)pAVar20[1].size_,*(undefined8 *)this_00);
          pAVar15 = pAStack_1a8;
          uVar17 = local_1b8._8_8_;
          pAVar16 = unaff_R13;
          pAVar18 = (ArrayPtr<const_char> *)this;
          if (local_1b8[0] == (_)0x1) {
            local_161._1_8_ = local_1a0;
            pAVar14 = (ArrayPtr<const_char> *)(local_1b8 + 8);
            local_1b8._8_8_ = (ArrayPtr<const_char> *)0x0;
            pAStack_1a8 = (ArrayPtr<const_char> *)0x0;
            pAVar16 = pAVar15;
            pAVar18 = (ArrayPtr<const_char> *)uVar17;
          }
          pAVar15 = pAStack_1a8;
          uVar17 = local_1b8._8_8_;
          local_198.content.ptr = (char *)CONCAT71(local_198.content.ptr._1_7_,local_1b8[0]);
          unaff_R13 = pAVar16;
          this = (MainImpl *)pAVar18;
          if (local_1b8[0] != (_)0x0) {
            local_180 = (ArrayPtr<const_char> *)local_161._1_8_;
            this = (MainImpl *)0x0;
            unaff_R13 = (ArrayPtr<const_char> *)0x0;
            pAVar14 = (ArrayPtr<const_char> *)local_161._1_8_;
            local_198.content.size_ = (size_t)pAVar18;
            local_198.content.disposer = (ArrayDisposer *)pAVar16;
          }
          if ((local_1b8[0] == (_)0x1) &&
             ((ArrayPtr<const_char> *)local_1b8._8_8_ != (ArrayPtr<const_char> *)0x0)) {
            local_1b8._8_8_ = (ArrayPtr<const_char> *)0x0;
            pAStack_1a8 = (ArrayPtr<const_char> *)0x0;
            pAVar28 = pAVar15;
            (**(code **)((ArrayPtr<const_char> *)&local_1a0->ptr)->ptr)(local_1a0,uVar17,1);
            pAVar14 = pAVar15;
          }
          if ((char)local_198.content.ptr == '\x01') {
            str<kj::StringPtr&,char_const(&)[3],kj::String&>
                      ((String *)local_1b8,this_00,(StringPtr *)0x322a4d,
                       (char (*) [3])&local_198.content.size_,(String *)pAVar28);
            pcVar22 = (char *)local_1b8._0_8_;
            if ((ArrayPtr<const_char> *)local_1b8._8_8_ == (ArrayPtr<const_char> *)0x0) {
              pcVar22 = "";
            }
            message.content.size_ =
                 (char *)((long)&((ArrayPtr<const_char> *)local_1b8._8_8_)->ptr +
                         (ulong)((ArrayPtr<const_char> *)local_1b8._8_8_ ==
                                (ArrayPtr<const_char> *)0x0));
            programName_00.content.size_ = local_170;
            programName_00.content.ptr = local_178;
            message.content.ptr = pcVar22;
            usageError((MainImpl *)pAVar25,programName_00,message);
          }
          this_00 = this_00 + 0x10;
          uVar26 = uVar26 + 1;
        } while (uVar26 < *(uint *)&pAVar20[2].ptr);
        local_d8 = (ArrayPtr<const_char> *)CONCAT44(local_d8._4_4_,(int)local_d8 - uVar26);
      }
      if (uVar26 < *(uint *)((long)&pAVar20[2].ptr + 4)) {
        local_130 = (ulong)local_d8 & 0xffffffff;
        lVar19 = -(long)this_00;
        do {
          if ((long)((long)local_f8.builder.pos + lVar19) >> 4 <= (long)local_130) break;
          pAVar14 = *(ArrayPtr<const_char> **)(this_00 + 8);
          (*(code *)**(undefined8 **)pAVar20[1].size_)
                    (local_1b8,(undefined8 *)pAVar20[1].size_,*(undefined8 *)this_00);
          uVar17 = local_1b8._8_8_;
          pAVar15 = local_128;
          if (local_1b8[0] == (_)0x1) {
            local_120 = pAStack_1a8;
            local_100 = local_1a0;
            pAVar14 = (ArrayPtr<const_char> *)(local_1b8 + 8);
            local_1b8._8_8_ = (ArrayPtr<const_char> *)0x0;
            pAStack_1a8 = (ArrayPtr<const_char> *)0x0;
            pAVar15 = (ArrayPtr<const_char> *)uVar17;
          }
          pAVar16 = pAStack_1a8;
          uVar17 = local_1b8._8_8_;
          local_198.content.ptr = (char *)CONCAT71(local_198.content.ptr._1_7_,local_1b8[0]);
          local_128 = pAVar15;
          if (local_1b8[0] != (_)0x0) {
            local_198.content.disposer = (ArrayDisposer *)local_120;
            local_180 = local_100;
            local_128 = (ArrayPtr<const_char> *)0x0;
            local_120 = (ArrayPtr<const_char> *)0x0;
            pAVar14 = local_100;
            local_198.content.size_ = (size_t)pAVar15;
          }
          if ((local_1b8[0] == (_)0x1) &&
             ((ArrayPtr<const_char> *)local_1b8._8_8_ != (ArrayPtr<const_char> *)0x0)) {
            local_1b8._8_8_ = (ArrayPtr<const_char> *)0x0;
            pAStack_1a8 = (ArrayPtr<const_char> *)0x0;
            pAVar28 = pAVar16;
            (**(code **)((ArrayPtr<const_char> *)&local_1a0->ptr)->ptr)(local_1a0,uVar17,1);
            pAVar14 = pAVar16;
          }
          if ((char)local_198.content.ptr == '\x01') {
            str<kj::StringPtr&,char_const(&)[3],kj::String&>
                      ((String *)local_1b8,this_00,(StringPtr *)0x322a4d,
                       (char (*) [3])&local_198.content.size_,(String *)pAVar28);
            pcVar22 = (char *)local_1b8._0_8_;
            if ((ArrayPtr<const_char> *)local_1b8._8_8_ == (ArrayPtr<const_char> *)0x0) {
              pcVar22 = "";
            }
            message_01.content.size_ =
                 (char *)((long)&((ArrayPtr<const_char> *)local_1b8._8_8_)->ptr +
                         (ulong)((ArrayPtr<const_char> *)local_1b8._8_8_ ==
                                (ArrayPtr<const_char> *)0x0));
            programName_02.content.size_ = local_170;
            programName_02.content.ptr = local_178;
            message_01.content.ptr = pcVar22;
            usageError((MainImpl *)pAVar25,programName_02,message_01);
          }
          this_00 = this_00 + 0x10;
          uVar26 = uVar26 + 1;
          lVar19 = lVar19 + -0x10;
        } while (uVar26 < *(uint *)((long)&pAVar20[2].ptr + 4));
      }
      pAVar20 = (ArrayPtr<const_char> *)&pAVar20[2].size_;
    } while (pAVar20 != local_108);
  }
  if (this_00 < local_f8.builder.pos) {
    str<kj::StringPtr&,char_const(&)[21]>
              (&local_198,this_00,(StringPtr *)": too many arguments",(char (*) [21])pAVar14);
    pcVar22 = local_198.content.ptr;
    if ((ArrayPtr<const_char> *)local_198.content.size_ == (ArrayPtr<const_char> *)0x0) {
      pcVar22 = "";
    }
    message_13.content.size_ =
         (char *)((long)&((ArrayPtr<const_char> *)local_198.content.size_)->ptr +
                 (ulong)((ArrayPtr<const_char> *)local_198.content.size_ ==
                        (ArrayPtr<const_char> *)0x0));
    programName_16.content.size_ = local_170;
    programName_16.content.ptr = local_178;
    message_13.content.ptr = pcVar22;
    usageError((MainImpl *)pAVar25,programName_16,message_13);
  }
  if (*(char *)(pAVar25->size_ + 0x108) == '\x01') {
    pAVar20 = *(ArrayPtr<const_char> **)(pAVar25->size_ + 0x118);
    pAVar28 = (ArrayPtr<const_char> *)local_1b8;
    (**(code **)((ArrayPtr<const_char> *)&pAVar20->ptr)->ptr)();
    pAVar15 = pAStack_1a8;
    uVar17 = local_1b8._8_8_;
    if (local_1b8[0] == (_)0x1) {
      local_1b8._8_8_ = (ArrayPtr<const_char> *)0x0;
      pAStack_1a8 = (ArrayPtr<const_char> *)0x0;
      pAVar14 = pAVar15;
      pAVar20 = (ArrayPtr<const_char> *)uVar17;
      pAVar28 = local_1a0;
    }
    local_198.content.ptr = (char *)CONCAT71(local_198.content.ptr._1_7_,local_1b8[0]);
    if (local_1b8[0] != (_)0x0) {
      local_198.content.size_ = (size_t)pAVar20;
      local_198.content.disposer = (ArrayDisposer *)pAVar14;
      local_180 = pAVar28;
      pAVar20 = (ArrayPtr<const_char> *)0x0;
    }
    if (((byte)local_1b8[0] & pAVar20 != (ArrayPtr<const_char> *)0x0) == 1) {
      (**(code **)((ArrayPtr<const_char> *)&pAVar28->ptr)->ptr)();
    }
    pAVar28 = pAStack_1a8;
    uVar17 = local_1b8._8_8_;
    if ((local_1b8[0] == (_)0x1) &&
       ((ArrayPtr<const_char> *)local_1b8._8_8_ != (ArrayPtr<const_char> *)0x0)) {
      local_1b8._8_8_ = (ArrayPtr<const_char> *)0x0;
      pAStack_1a8 = (ArrayPtr<const_char> *)0x0;
      (**(code **)((ArrayPtr<const_char> *)&local_1a0->ptr)->ptr)
                (local_1a0,uVar17,1,pAVar28,pAVar28,0);
    }
    if ((char)local_198.content.ptr == '\x01') {
      pAVar28 = (ArrayPtr<const_char> *)local_198.content.size_;
      if ((ArrayPtr<const_char> *)local_198.content.disposer == (ArrayPtr<const_char> *)0x0) {
        pAVar28 = (ArrayPtr<const_char> *)0x324321;
      }
      message_14.content.size_ =
           (char *)((long)&((ArrayPtr<const_char> *)&(local_198.content.disposer)->field_0x0)->ptr +
                   (ulong)((ArrayPtr<const_char> *)local_198.content.disposer ==
                          (ArrayPtr<const_char> *)0x0));
      programName_17.content.size_ = local_170;
      programName_17.content.ptr = local_178;
      message_14.content.ptr = (char *)pAVar28;
      usageError((MainImpl *)pAVar25,programName_17,message_14);
    }
  }
LAB_002b3ca2:
  pSVar6 = local_f8.builder.endPtr;
  pRVar5 = local_f8.builder.pos;
  pSVar4 = local_f8.builder.ptr;
  if ((kj *)local_f8.builder.ptr != (kj *)0x0) {
    local_f8.builder.ptr = (StringPtr *)0x0;
    local_f8.builder.pos = (RemoveConst<kj::StringPtr> *)0x0;
    local_f8.builder.endPtr = (StringPtr *)0x0;
    (*(code *)**(undefined8 **)local_f8.builder.disposer)
              (local_f8.builder.disposer,pSVar4,0x10,(long)pRVar5 - (long)pSVar4 >> 4,
               (long)pSVar6 - (long)pSVar4 >> 4,0);
  }
  return;
  while( true ) {
    if (iVar7 != 0) break;
    pAVar28 = (ArrayPtr<const_char> *)(ulong)((int)unaff_R13 + 3 + uVar26);
    uVar26 = uVar26 + 1;
    if (local_128 <= pAVar28) break;
LAB_002b405e:
    if (((ArrayPtr<const_char> *)(local_161._1_8_ + pAVar28 * 0x10))->size_ == 7) {
      iVar7 = bcmp(((ArrayPtr<const_char> *)
                   &((ArrayPtr<const_char> *)(local_161._1_8_ + pAVar28 * 0x10))->ptr)->ptr,"--help"
                   ,6);
    }
    else {
      if (((ArrayPtr<const_char> *)(local_161._1_8_ + pAVar28 * 0x10))->size_ != 5) break;
      iVar7 = bcmp(((ArrayPtr<const_char> *)
                   &((ArrayPtr<const_char> *)(local_161._1_8_ + pAVar28 * 0x10))->ptr)->ptr,"help",4
                  );
    }
  }
LAB_002b40bf:
  if (uVar26 == 0) {
    plVar24 = (long *)*puVar11;
    puVar11 = (undefined8 *)(*plVar24 + 0x28);
    uVar17 = 0x27;
    pcVar22 = "Help about help?  We must go deeper...";
  }
  else if (uVar26 == 1) {
    plVar24 = (long *)*puVar11;
    puVar11 = (undefined8 *)(*plVar24 + 0x28);
    uVar17 = 0x6d;
    pcVar22 = 
    "Yo dawg, I heard you like help.  So I wrote you some help about how to use help so you can get help on help."
    ;
  }
  else if (uVar26 == 2) {
    plVar24 = (long *)*puVar11;
    puVar11 = (undefined8 *)(*plVar24 + 0x28);
    uVar17 = 0x2a;
    pcVar22 = "Help, I\'m trapped in a help text factory!";
  }
  else {
    plVar24 = (long *)*puVar11;
    if (uVar26 < 10) {
      puVar11 = (undefined8 *)(*plVar24 + 0x20);
      uVar17 = 0x1f;
      pcVar22 = "Killed by signal 911 (SIGHELP)";
    }
    else {
      puVar11 = (undefined8 *)(*plVar24 + 0x28);
      uVar17 = 0x1d;
      pcVar22 = "How to keep an idiot busy...";
    }
  }
  uVar17 = (*(code *)*puVar11)(plVar24,pcVar22,uVar17);
  __clang_call_terminate(uVar17);
}

Assistant:

void MainBuilder::MainImpl::operator()(StringPtr programName, ArrayPtr<const StringPtr> params) {
  Vector<StringPtr> arguments;

  for (size_t i = 0; i < params.size(); i++) {
    StringPtr param = params[i];
    if (param == "--") {
      // "--" ends option parsing.
      arguments.addAll(params.begin() + i + 1, params.end());
      break;
    } else if (param.startsWith("--")) {
      // Long option.
      ArrayPtr<const char> name;
      Maybe<StringPtr> maybeArg;
      KJ_IF_MAYBE(pos, param.findFirst('=')) {
        name = param.slice(2, *pos);
        maybeArg = param.slice(*pos + 1);
      } else {
        name = param.slice(2);
      }
      auto iter = impl->longOptions.find(name);
      if (iter == impl->longOptions.end()) {
        if (param == "--help") {
          printHelp(programName);
        } else {
          usageError(programName, str("--", name, ": unrecognized option"));
        }
      } else {
        const Impl::Option& option = *iter->second;
        if (option.hasArg) {
          // Argument expected.
          KJ_IF_MAYBE(arg, maybeArg) {
            // "--foo=blah": "blah" is the argument.
            KJ_IF_MAYBE(error, (*option.funcWithArg)(*arg).releaseError()) {
              usageError(programName, str(param, ": ", *error));
            }
          } else if (i + 1 < params.size() &&
                     !(params[i + 1].startsWith("-") && params[i + 1].size() > 1)) {
            // "--foo blah": "blah" is the argument.
            ++i;
            KJ_IF_MAYBE(error, (*option.funcWithArg)(params[i]).releaseError()) {
              usageError(programName, str(param, "=", params[i], ": ", *error));
            }
          } else {
            usageError(programName, str("--", name, ": missing argument"));
          }
        } else {
          // No argument expected.
          if (maybeArg == nullptr) {
            KJ_IF_MAYBE(error, (*option.func)().releaseError()) {
              usageError(programName, str(param, ": ", *error));
            }
          } else {
            usageError(programName, str("--", name, ": option does not accept an argument"));
          }
        }
      }
    }